

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O3

void __thiscall
amrex::CoordSys::GetEdgeLoc
          (CoordSys *this,Vector<double,_std::allocator<double>_> *loc,Box *region,int dir)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  ulong __new_size;
  
  iVar3 = (region->smallend).vect[dir];
  lVar6 = (long)(region->bigend).vect[dir] - (long)iVar3;
  __new_size = lVar6 + 2;
  dVar1 = this->dx[dir];
  dVar2 = this->offset[dir];
  std::vector<double,_std::allocator<double>_>::resize
            (&loc->super_vector<double,_std::allocator<double>_>,__new_size);
  if (-2 < (int)lVar6) {
    pdVar4 = (loc->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar5 = 0;
    do {
      pdVar4[uVar5] = (double)(int)uVar5 * this->dx[dir] + (double)iVar3 * dVar1 + dVar2;
      uVar5 = uVar5 + 1;
    } while ((__new_size & 0xffffffff) != uVar5);
  }
  return;
}

Assistant:

void
CoordSys::GetEdgeLoc (Vector<Real>& loc,
                      const Box&    region,
                      int           dir) const
{
    AMREX_ASSERT(ok);
    AMREX_ASSERT(region.cellCentered());
    const int* lo = region.loVect();
    const int* hi = region.hiVect();
    int len       = hi[dir] - lo[dir] + 2;
    Real off      = offset[dir] + dx[dir]*lo[dir];
    loc.resize(len);
    AMREX_PRAGMA_SIMD
    for (int i = 0; i < len; i++)
    {
        loc[i] = off + dx[dir]*i;
    }
}